

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers_test.cpp
# Opt level: O2

void __thiscall TypePack_HasType_Test::~TypePack_HasType_Test(TypePack_HasType_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TypePack, HasType) {
    using Pack = TypePack<signed int, float, double>;

    // Extra parens so EXPECT_TRUE doesn't get confused by the comma
    EXPECT_TRUE((HasType<int, Pack>::value));
    EXPECT_TRUE((HasType<float, Pack>::value));
    EXPECT_TRUE((HasType<double, Pack>::value));

    EXPECT_FALSE((HasType<char, Pack>::value));
    EXPECT_FALSE((HasType<unsigned int, Pack>::value));
}